

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

void __thiscall
openjij::test::RESULT_GetSolutionFromTrotter_Test::TestBody
          (RESULT_GetSolutionFromTrotter_Test *this)

{
  pointer piVar1;
  pointer piVar2;
  float *pfVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  TransverseIsing<openjij::graph::Dense<float>_> *system;
  char *message;
  long lVar5;
  initializer_list<int> __l;
  TrotterSpins init_trotter_spins;
  Spins solution;
  Dense<float> graph;
  TransverseIsing<openjij::graph::Dense<float>_> q_sys;
  AssertHelper AStack_128;
  Message local_120;
  allocator_type local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  TrotterSpins local_108;
  Spins local_e8;
  Dense<float> local_c8;
  TransverseIsing<openjij::graph::Dense<float>_> local_a8;
  Xorshift local_38;
  
  openjij::graph::Dense<float>::Dense(&local_c8,4);
  pfVar3 = openjij::graph::Dense<float>::J(&local_c8,1,1);
  *pfVar3 = -1.0;
  pfVar3 = openjij::graph::Dense<float>::J(&local_c8,0,1);
  *pfVar3 = -1.0;
  pfVar3 = openjij::graph::Dense<float>::J(&local_c8,1,2);
  *pfVar3 = -1.0;
  pfVar3 = openjij::graph::Dense<float>::J(&local_c8,2,3);
  *pfVar3 = 1.0;
  local_38.x = 0x75bcd15;
  local_38.y = 0x159a55e5;
  local_38.z = 0x1f123bb5;
  local_38.w = 0x4d2;
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = (vector<int,_std::allocator<int>_> *)operator_new(0x60);
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4 + 4;
  pvVar4[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar4[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar4[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar4[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pvVar4[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pvVar4[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar4[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar4[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar4[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lVar5 = 0;
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar4;
  local_108.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  do {
    openjij::graph::Graph::gen_spin<openjij::utility::Xorshift>
              ((Spins *)&local_a8,&local_c8.super_Graph,&local_38);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar5),
               (vector<int,_std::allocator<int>_> *)&local_a8);
    if (local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
        m_storage.m_data != (float *)0x0) {
      operator_delete(local_a8.trotter_spins.
                      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data,local_a8.trotter_spins.
                             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols -
                             (long)local_a8.trotter_spins.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data);
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x60);
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000001;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0xffffffff00000001;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a8,__l,local_118);
  piVar1 = ((local_108.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  piVar2 = ((local_108.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  ((local_108.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_a8.trotter_spins.
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  ((local_108.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_a8.trotter_spins.
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  ((local_108.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a8.trotter_spins.
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (float *)0x0;
  local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    if (local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
        m_storage.m_data != (float *)0x0) {
      operator_delete(local_a8.trotter_spins.
                      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data,local_a8.trotter_spins.
                             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols -
                             (long)local_a8.trotter_spins.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data);
    }
  }
  openjij::system::TransverseIsing<openjij::graph::Dense<float>_>::TransverseIsing
            (&local_a8,&local_108,&local_c8,1.0);
  openjij::result::get_solution<openjij::graph::Dense<float>>(&local_e8,(result *)&local_a8,system);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)local_118,"solution","init_trotter_spins[0]",&local_e8,
             local_108.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_118[0] == (allocator_type)0x0) {
    testing::Message::Message(&local_120);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/result/result.hpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&AStack_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    if (local_120.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_120.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_a8.dE.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  free(local_a8.rand_pool.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_a8.interaction.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.
       m_storage.m_data);
  free(local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_108);
  free(local_c8._J.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_data)
  ;
  return;
}

Assistant:

TEST(RESULT, GetSolutionFromTrotter){
   auto graph = openjij::graph::Dense<float>(4);
   graph.J(1, 1) = -1.0;
   graph.J(0, 1) = -1.0;
   graph.J(1, 2) = -1.0;
   graph.J(2, 3) = 1.0;
   
   auto r = openjij::utility::Xorshift(1234);
   int num_trotter_slices = 4;
   openjij::system::TrotterSpins init_trotter_spins(num_trotter_slices);
   for(auto& spins : init_trotter_spins){
      spins = graph.gen_spin(r);
   }
   
   init_trotter_spins[0] = openjij::graph::Spins({1, 1, 1, -1});
   
   auto q_sys = openjij::system::make_transverse_ising(init_trotter_spins, graph, 1.0);
   // get_solution get minimum energy state
   auto solution = openjij::result::get_solution(q_sys);
   EXPECT_EQ(solution, init_trotter_spins[0]);
}